

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O0

socket_t Rainbow::connectsock(string *host,string *service,string *transport)

{
  sockaddr *psVar1;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  size_t *__idx;
  servent *psVar5;
  protoent *ppVar6;
  int type;
  socket_t sd;
  protoent *pProtocol;
  servent *pServen;
  addrinfo hint;
  addrinfo *pAip;
  sockaddr_in sin;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  addrinfo local_68;
  addrinfo *local_38;
  sockaddr local_30 [2];
  socket_t local_4;
  
  local_68.ai_flags = 2;
  local_68.ai_family = 2;
  local_68.ai_socktype = 0;
  local_68.ai_protocol = 0;
  local_68.ai_addrlen = 0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar3 = getaddrinfo(pcVar4,(char *)0x0,&local_68,&local_38);
  if (iVar3 == 0) {
    if (local_38 != (addrinfo *)0x0) {
      psVar1 = local_38->ai_addr;
      local_30[0].sa_family = psVar1->sa_family;
      local_30[0].sa_data[0] = psVar1->sa_data[0];
      local_30[0].sa_data[1] = psVar1->sa_data[1];
      local_30[0].sa_data[2] = psVar1->sa_data[2];
      local_30[0].sa_data[3] = psVar1->sa_data[3];
      local_30[0].sa_data[4] = psVar1->sa_data[4];
      local_30[0].sa_data[5] = psVar1->sa_data[5];
      local_30[0].sa_data._6_8_ = *(undefined8 *)(psVar1->sa_data + 6);
      freeaddrinfo(local_38);
    }
    __idx = (size_t *)std::__cxx11::string::c_str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    psVar5 = getservbyname((char *)__idx,pcVar4);
    if (psVar5 == (servent *)0x0) {
      iVar3 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),__idx
                                 ,0);
      uVar2 = htons((uint16_t)iVar3);
      local_30[0].sa_data._0_2_ = uVar2;
      if (uVar2 == 0) {
        return -1;
      }
    }
    else {
      local_30[0].sa_data._0_2_ = (short)psVar5->s_port;
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    ppVar6 = getprotobyname(pcVar4);
    if (ppVar6 == (protoent *)0x0) {
      local_4 = -1;
    }
    else {
      iVar3 = strcasecmp(ppVar6->p_name,"tcp");
      if (iVar3 == 0) {
        iVar3 = 1;
      }
      else {
        iVar3 = 2;
      }
      local_4 = socket(2,iVar3,ppVar6->p_proto);
      if (local_4 == -1) {
        local_4 = -1;
      }
      else {
        iVar3 = connect(local_4,local_30,0x10);
        if (iVar3 == -1) {
          close(local_4);
          local_4 = -1;
        }
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

socket_t connectsock(const std::string &host,
					const std::string &service,
					const std::string &transport)
	{
		struct   sockaddr_in	sin;

#ifdef _WIN32 
		struct   hostent		*pHost;
		struct   servent		*pServen;
		struct   protoent		*pProtocol;

		if(pHost = gethostbyname(host.c_str()))
			memcpy(&sin.sin_addr, pHost->h_addr, pHost->h_length);
		else if((sin.sin_addr.s_addr = inet_addr(host.c_str())) == INADDR_NONE)
			return INVALID_SOCKET;

#endif
#ifdef __linux__ 
		struct   addrinfo		*pAip;
		struct   addrinfo        hint;
		struct	 servent		*pServen;
		struct   protoent		*pProtocol;

		hint.ai_flags = AI_CANONNAME;
		hint.ai_family = AF_INET;
		hint.ai_socktype = 0;
		hint.ai_protocol = 0;
		hint.ai_addrlen = 0;
		hint.ai_canonname = NULL;
		hint.ai_addr = NULL;
		hint.ai_next = NULL;

		if(getaddrinfo(host.c_str(), NULL, &hint, &pAip) != 0)
			return INVALID_SOCKET;
		if(pAip)
		{
			memcpy(&sin, (struct sockaddr_in *)pAip->ai_addr, sizeof(sin));
			freeaddrinfo(pAip);
		}

#endif
		socket_t sd;
		int type;

		if((pServen = getservbyname(service.c_str(), transport.c_str())) != 0)
			sin.sin_port = pServen->s_port;
		else if((sin.sin_port = htons((u_short)std::stoi(service))) == 0)
			return INVALID_SOCKET;

		if((pProtocol = getprotobyname(transport.c_str())) == 0)
			return INVALID_SOCKET;

		if(strcasecmp(pProtocol->p_name, "tcp") == 0)
			type = SOCK_STREAM;
		else
			type = SOCK_DGRAM;

		sd = socket(AF_INET, type, pProtocol->p_proto);
		if(sd == INVALID_SOCKET)
			return INVALID_SOCKET;
		
		if(connect(sd, (sockaddr *)&sin, sizeof(sin)) == SOCKET_ERROR)
		{
			closesocket(sd);
			return INVALID_SOCKET;
		}

		return sd;
	}